

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  byte bVar14;
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  ulong uVar23;
  InstancePrimitive *prim;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1008 [8];
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    bVar15 = false;
  }
  else {
    uStack_f70 = 0;
    fVar1 = (context->query_radius).field_0.m128[0];
    auVar26 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_fe8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar3 = (context->query_radius).field_0;
      local_fe8 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    }
    pauVar21 = (undefined1 (*) [16])local_f68;
    uVar2 = *(undefined4 *)&(query->p).field_0;
    local_ff8._4_4_ = uVar2;
    local_ff8._0_4_ = uVar2;
    local_ff8._8_4_ = uVar2;
    local_ff8._12_4_ = uVar2;
    auVar47 = ZEXT1664(local_ff8);
    local_fb8 = *(float *)((long)&(query->p).field_0 + 4);
    fStack_fb4 = local_fb8;
    fStack_fb0 = local_fb8;
    fStack_fac = local_fb8;
    local_fc8 = *(float *)((long)&(query->p).field_0 + 8);
    fStack_fc4 = local_fc8;
    fStack_fc0 = local_fc8;
    fStack_fbc = local_fc8;
    local_f98 = (context->query_radius).field_0.m128[1];
    fStack_f94 = local_f98;
    fStack_f90 = local_f98;
    fStack_f8c = local_f98;
    local_fa8 = (context->query_radius).field_0.m128[2];
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
    auVar24 = vshufps_avx(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(fVar1 * fVar1)),0);
    bVar15 = false;
    do {
      local_fd8 = auVar26._0_16_;
      local_f88 = vsubps_avx(auVar47._0_16_,local_fd8);
      auVar25._0_4_ = auVar47._0_4_ + auVar26._0_4_;
      auVar25._4_4_ = auVar47._4_4_ + auVar26._4_4_;
      auVar25._8_4_ = auVar47._8_4_ + auVar26._8_4_;
      auVar25._12_4_ = auVar47._12_4_ + auVar26._12_4_;
      auVar8._4_4_ = fStack_fb4;
      auVar8._0_4_ = local_fb8;
      auVar8._8_4_ = fStack_fb0;
      auVar8._12_4_ = fStack_fac;
      auVar6._4_4_ = fStack_f94;
      auVar6._0_4_ = local_f98;
      auVar6._8_4_ = fStack_f90;
      auVar6._12_4_ = fStack_f8c;
      auVar8 = vsubps_avx(auVar8,auVar6);
      auVar27._0_4_ = local_fb8 + local_f98;
      auVar27._4_4_ = fStack_fb4 + fStack_f94;
      auVar27._8_4_ = fStack_fb0 + fStack_f90;
      auVar27._12_4_ = fStack_fac + fStack_f8c;
      auVar9._4_4_ = fStack_fc4;
      auVar9._0_4_ = local_fc8;
      auVar9._8_4_ = fStack_fc0;
      auVar9._12_4_ = fStack_fbc;
      auVar30._4_4_ = fStack_fa4;
      auVar30._0_4_ = local_fa8;
      auVar30._8_4_ = fStack_fa0;
      auVar30._12_4_ = fStack_f9c;
      auVar9 = vsubps_avx(auVar9,auVar30);
      auVar28._0_4_ = local_fc8 + local_fa8;
      auVar28._4_4_ = fStack_fc4 + fStack_fa4;
      auVar28._8_4_ = fStack_fc0 + fStack_fa0;
      auVar28._12_4_ = fStack_fbc + fStack_f9c;
      while( true ) {
        pauVar13 = pauVar21 + -1;
        pauVar21 = pauVar21 + -1;
        if ((float)local_fe8._0_4_ < *(float *)(*pauVar13 + 8)) break;
        uVar22 = *(ulong *)*pauVar21;
LAB_011eae88:
        uVar18 = (uint)uVar22;
        auVar30 = auVar47._0_16_;
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar22 & 8) == 0) {
            uVar17 = uVar22 & 0xfffffffffffffff0;
            fVar1 = query->time;
            auVar29._4_4_ = fVar1;
            auVar29._0_4_ = fVar1;
            auVar29._8_4_ = fVar1;
            auVar29._12_4_ = fVar1;
            auVar32._0_4_ = fVar1 * *(float *)(uVar17 + 0x80) + *(float *)(uVar17 + 0x20);
            auVar32._4_4_ = fVar1 * *(float *)(uVar17 + 0x84) + *(float *)(uVar17 + 0x24);
            auVar32._8_4_ = fVar1 * *(float *)(uVar17 + 0x88) + *(float *)(uVar17 + 0x28);
            auVar32._12_4_ = fVar1 * *(float *)(uVar17 + 0x8c) + *(float *)(uVar17 + 0x2c);
            auVar35._0_4_ = fVar1 * *(float *)(uVar17 + 0xa0) + *(float *)(uVar17 + 0x40);
            auVar35._4_4_ = fVar1 * *(float *)(uVar17 + 0xa4) + *(float *)(uVar17 + 0x44);
            auVar35._8_4_ = fVar1 * *(float *)(uVar17 + 0xa8) + *(float *)(uVar17 + 0x48);
            auVar35._12_4_ = fVar1 * *(float *)(uVar17 + 0xac) + *(float *)(uVar17 + 0x4c);
            auVar38._0_4_ = fVar1 * *(float *)(uVar17 + 0xc0) + *(float *)(uVar17 + 0x60);
            auVar38._4_4_ = fVar1 * *(float *)(uVar17 + 0xc4) + *(float *)(uVar17 + 100);
            auVar38._8_4_ = fVar1 * *(float *)(uVar17 + 200) + *(float *)(uVar17 + 0x68);
            auVar38._12_4_ = fVar1 * *(float *)(uVar17 + 0xcc) + *(float *)(uVar17 + 0x6c);
            auVar40._0_4_ = fVar1 * *(float *)(uVar17 + 0x90) + *(float *)(uVar17 + 0x30);
            auVar40._4_4_ = fVar1 * *(float *)(uVar17 + 0x94) + *(float *)(uVar17 + 0x34);
            auVar40._8_4_ = fVar1 * *(float *)(uVar17 + 0x98) + *(float *)(uVar17 + 0x38);
            auVar40._12_4_ = fVar1 * *(float *)(uVar17 + 0x9c) + *(float *)(uVar17 + 0x3c);
            auVar43._0_4_ = fVar1 * *(float *)(uVar17 + 0xb0) + *(float *)(uVar17 + 0x50);
            auVar43._4_4_ = fVar1 * *(float *)(uVar17 + 0xb4) + *(float *)(uVar17 + 0x54);
            auVar43._8_4_ = fVar1 * *(float *)(uVar17 + 0xb8) + *(float *)(uVar17 + 0x58);
            auVar43._12_4_ = fVar1 * *(float *)(uVar17 + 0xbc) + *(float *)(uVar17 + 0x5c);
            auVar45._0_4_ = fVar1 * *(float *)(uVar17 + 0xd0) + *(float *)(uVar17 + 0x70);
            auVar45._4_4_ = fVar1 * *(float *)(uVar17 + 0xd4) + *(float *)(uVar17 + 0x74);
            auVar45._8_4_ = fVar1 * *(float *)(uVar17 + 0xd8) + *(float *)(uVar17 + 0x78);
            auVar45._12_4_ = fVar1 * *(float *)(uVar17 + 0xdc) + *(float *)(uVar17 + 0x7c);
            auVar6 = vmaxps_avx(auVar30,auVar32);
            auVar6 = vminps_avx(auVar6,auVar40);
            auVar6 = vsubps_avx(auVar6,auVar30);
            auVar12._4_4_ = fStack_fb4;
            auVar12._0_4_ = local_fb8;
            auVar12._8_4_ = fStack_fb0;
            auVar12._12_4_ = fStack_fac;
            auVar30 = vmaxps_avx(auVar12,auVar35);
            auVar30 = vminps_avx(auVar30,auVar43);
            auVar10 = vsubps_avx(auVar30,auVar12);
            auVar11._4_4_ = fStack_fc4;
            auVar11._0_4_ = local_fc8;
            auVar11._8_4_ = fStack_fc0;
            auVar11._12_4_ = fStack_fbc;
            auVar30 = vmaxps_avx(auVar11,auVar38);
            auVar30 = vminps_avx(auVar30,auVar45);
            auVar30 = vsubps_avx(auVar30,auVar11);
            local_1008._0_4_ =
                 auVar6._0_4_ * auVar6._0_4_ + auVar10._0_4_ * auVar10._0_4_ +
                 auVar30._0_4_ * auVar30._0_4_;
            local_1008._4_4_ =
                 auVar6._4_4_ * auVar6._4_4_ + auVar10._4_4_ * auVar10._4_4_ +
                 auVar30._4_4_ * auVar30._4_4_;
            fStack_1000 = auVar6._8_4_ * auVar6._8_4_ + auVar10._8_4_ * auVar10._8_4_ +
                          auVar30._8_4_ * auVar30._8_4_;
            fStack_ffc = auVar6._12_4_ * auVar6._12_4_ + auVar10._12_4_ * auVar10._12_4_ +
                         auVar30._12_4_ * auVar30._12_4_;
            auVar30 = vcmpps_avx(_local_1008,auVar24,2);
            auVar6 = vcmpps_avx(auVar32,auVar40,2);
            auVar30 = vandps_avx(auVar30,auVar6);
            if ((uVar18 & 7) == 6) {
LAB_011eb12f:
              auVar6 = vcmpps_avx(*(undefined1 (*) [16])((uVar22 & 0xfffffffffffffff0) + 0xe0),
                                  auVar29,2);
              auVar10 = vcmpps_avx(auVar29,*(undefined1 (*) [16])
                                            ((uVar22 & 0xfffffffffffffff0) + 0xf0),1);
              auVar6 = vandps_avx(auVar6,auVar10);
              auVar30 = vandps_avx(auVar30,auVar6);
              auVar30 = vpslld_avx(auVar30,0x1f);
              uVar18 = vmovmskps_avx(auVar30);
              uVar17 = (ulong)uVar18;
            }
            else {
              uVar18 = vmovmskps_avx(auVar30);
              uVar17 = (ulong)uVar18;
            }
            goto LAB_011eaf71;
          }
LAB_011eb2d1:
          lVar19 = (ulong)(uVar18 & 0xf) - 8;
          if (lVar19 != 0) {
            prim = (InstancePrimitive *)(uVar22 & 0xfffffffffffffff0);
            bVar14 = 0;
            do {
              bVar20 = bVar14;
              bVar16 = InstanceIntersector1MB::pointQuery(query,context,prim);
              prim = prim + 1;
              lVar19 = lVar19 + -1;
              bVar14 = bVar20 | bVar16;
            } while (lVar19 != 0);
            if (bVar20 == 0 && !bVar16) {
              auVar26 = ZEXT1664(local_fd8);
              auVar47 = ZEXT1664(local_ff8);
            }
            else {
              uVar2 = *(undefined4 *)&(context->query_radius).field_0;
              auVar26 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
              local_f98 = (context->query_radius).field_0.m128[1];
              fStack_f94 = local_f98;
              fStack_f90 = local_f98;
              fStack_f8c = local_f98;
              local_fa8 = (context->query_radius).field_0.m128[2];
              fStack_fa4 = local_fa8;
              fStack_fa0 = local_fa8;
              fStack_f9c = local_fa8;
              auVar47 = ZEXT1664(local_ff8);
              if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                local_fe8 = ZEXT416((uint)(query->radius * query->radius));
              }
              else {
                aVar3 = (context->query_radius).field_0;
                local_fe8 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
              }
              bVar15 = true;
            }
            goto LAB_011eb37a;
          }
          break;
        }
        if ((uVar22 & 8) != 0) goto LAB_011eb2d1;
        uVar17 = uVar22 & 0xfffffffffffffff0;
        fVar1 = query->time;
        auVar29._4_4_ = fVar1;
        auVar29._0_4_ = fVar1;
        auVar29._8_4_ = fVar1;
        auVar29._12_4_ = fVar1;
        auVar36._0_4_ = fVar1 * *(float *)(uVar17 + 0x80) + *(float *)(uVar17 + 0x20);
        auVar36._4_4_ = fVar1 * *(float *)(uVar17 + 0x84) + *(float *)(uVar17 + 0x24);
        auVar36._8_4_ = fVar1 * *(float *)(uVar17 + 0x88) + *(float *)(uVar17 + 0x28);
        auVar36._12_4_ = fVar1 * *(float *)(uVar17 + 0x8c) + *(float *)(uVar17 + 0x2c);
        auVar39._0_4_ = fVar1 * *(float *)(uVar17 + 0xa0) + *(float *)(uVar17 + 0x40);
        auVar39._4_4_ = fVar1 * *(float *)(uVar17 + 0xa4) + *(float *)(uVar17 + 0x44);
        auVar39._8_4_ = fVar1 * *(float *)(uVar17 + 0xa8) + *(float *)(uVar17 + 0x48);
        auVar39._12_4_ = fVar1 * *(float *)(uVar17 + 0xac) + *(float *)(uVar17 + 0x4c);
        auVar33._0_4_ = fVar1 * *(float *)(uVar17 + 0xc0) + *(float *)(uVar17 + 0x60);
        auVar33._4_4_ = fVar1 * *(float *)(uVar17 + 0xc4) + *(float *)(uVar17 + 100);
        auVar33._8_4_ = fVar1 * *(float *)(uVar17 + 200) + *(float *)(uVar17 + 0x68);
        auVar33._12_4_ = fVar1 * *(float *)(uVar17 + 0xcc) + *(float *)(uVar17 + 0x6c);
        auVar41._0_4_ = fVar1 * *(float *)(uVar17 + 0x90) + *(float *)(uVar17 + 0x30);
        auVar41._4_4_ = fVar1 * *(float *)(uVar17 + 0x94) + *(float *)(uVar17 + 0x34);
        auVar41._8_4_ = fVar1 * *(float *)(uVar17 + 0x98) + *(float *)(uVar17 + 0x38);
        auVar41._12_4_ = fVar1 * *(float *)(uVar17 + 0x9c) + *(float *)(uVar17 + 0x3c);
        auVar44._0_4_ = fVar1 * *(float *)(uVar17 + 0xb0) + *(float *)(uVar17 + 0x50);
        auVar44._4_4_ = fVar1 * *(float *)(uVar17 + 0xb4) + *(float *)(uVar17 + 0x54);
        auVar44._8_4_ = fVar1 * *(float *)(uVar17 + 0xb8) + *(float *)(uVar17 + 0x58);
        auVar44._12_4_ = fVar1 * *(float *)(uVar17 + 0xbc) + *(float *)(uVar17 + 0x5c);
        auVar46._0_4_ = fVar1 * *(float *)(uVar17 + 0xd0) + *(float *)(uVar17 + 0x70);
        auVar46._4_4_ = fVar1 * *(float *)(uVar17 + 0xd4) + *(float *)(uVar17 + 0x74);
        auVar46._8_4_ = fVar1 * *(float *)(uVar17 + 0xd8) + *(float *)(uVar17 + 0x78);
        auVar46._12_4_ = fVar1 * *(float *)(uVar17 + 0xdc) + *(float *)(uVar17 + 0x7c);
        auVar6 = vmaxps_avx(auVar30,auVar36);
        auVar6 = vminps_avx(auVar6,auVar41);
        auVar6 = vsubps_avx(auVar6,auVar30);
        auVar10._4_4_ = fStack_fb4;
        auVar10._0_4_ = local_fb8;
        auVar10._8_4_ = fStack_fb0;
        auVar10._12_4_ = fStack_fac;
        auVar30 = vmaxps_avx(auVar10,auVar39);
        auVar30 = vminps_avx(auVar30,auVar44);
        auVar10 = vsubps_avx(auVar30,auVar10);
        auVar7._4_4_ = fStack_fc4;
        auVar7._0_4_ = local_fc8;
        auVar7._8_4_ = fStack_fc0;
        auVar7._12_4_ = fStack_fbc;
        auVar30 = vmaxps_avx(auVar7,auVar33);
        auVar30 = vminps_avx(auVar30,auVar46);
        auVar30 = vsubps_avx(auVar30,auVar7);
        local_1008._4_4_ =
             auVar6._4_4_ * auVar6._4_4_ + auVar10._4_4_ * auVar10._4_4_ +
             auVar30._4_4_ * auVar30._4_4_;
        local_1008._0_4_ =
             auVar6._0_4_ * auVar6._0_4_ + auVar10._0_4_ * auVar10._0_4_ +
             auVar30._0_4_ * auVar30._0_4_;
        fStack_1000 = auVar6._8_4_ * auVar6._8_4_ + auVar10._8_4_ * auVar10._8_4_ +
                      auVar30._8_4_ * auVar30._8_4_;
        fStack_ffc = auVar6._12_4_ * auVar6._12_4_ + auVar10._12_4_ * auVar10._12_4_ +
                     auVar30._12_4_ * auVar30._12_4_;
        auVar30 = vcmpps_avx(auVar36,auVar41,2);
        auVar6 = vcmpps_avx(auVar44,auVar8,5);
        auVar30 = vandps_avx(auVar30,auVar6);
        auVar6 = vcmpps_avx(auVar36,auVar25,2);
        auVar10 = vcmpps_avx(auVar39,auVar27,2);
        auVar6 = vandps_avx(auVar10,auVar6);
        auVar10 = vcmpps_avx(auVar46,auVar9,5);
        auVar30 = vandps_avx(auVar30,auVar10);
        auVar10 = vcmpps_avx(auVar41,local_f88,5);
        auVar7 = vcmpps_avx(auVar33,auVar28,2);
        auVar10 = vandps_avx(auVar7,auVar10);
        auVar6 = vandps_avx(auVar6,auVar10);
        auVar30 = vandps_avx(auVar6,auVar30);
        if ((uVar18 & 7) == 6) {
          auVar47 = ZEXT1664(local_ff8);
          goto LAB_011eb12f;
        }
        auVar30 = vpslld_avx(auVar30,0x1f);
        uVar18 = vmovmskps_avx(auVar30);
        uVar17 = (ulong)uVar18;
        auVar47 = ZEXT1664(local_ff8);
LAB_011eaf71:
        if (uVar17 != 0) {
          uVar23 = uVar22 & 0xfffffffffffffff0;
          lVar19 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          uVar22 = *(ulong *)(uVar23 + lVar19 * 8);
          uVar18 = (uint)uVar17 - 1 & (uint)uVar17;
          if (uVar18 != 0) {
            uVar4 = *(uint *)(local_1008 + lVar19 * 4);
            lVar19 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            uVar17 = *(ulong *)(uVar23 + lVar19 * 8);
            uVar5 = *(uint *)(local_1008 + lVar19 * 4);
            uVar18 = uVar18 - 1 & uVar18;
            if (uVar18 == 0) {
              if (uVar4 < uVar5) {
                *(ulong *)*pauVar21 = uVar17;
                *(uint *)(*pauVar21 + 8) = uVar5;
                pauVar21 = pauVar21 + 1;
              }
              else {
                *(ulong *)*pauVar21 = uVar22;
                *(uint *)(*pauVar21 + 8) = uVar4;
                pauVar21 = pauVar21 + 1;
                uVar22 = uVar17;
              }
            }
            else {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar22;
              auVar30 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar4));
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar17;
              auVar6 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar5));
              lVar19 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              auVar37._8_8_ = 0;
              auVar37._0_8_ = *(ulong *)(uVar23 + lVar19 * 8);
              auVar7 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_1008 + lVar19 * 4)));
              auVar10 = vpcmpgtd_avx(auVar6,auVar30);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar29 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar6,auVar30,auVar29);
                auVar30 = vblendvps_avx(auVar30,auVar6,auVar29);
                auVar6 = vpcmpgtd_avx(auVar7,auVar10);
                auVar29 = vpshufd_avx(auVar6,0xaa);
                auVar6 = vblendvps_avx(auVar7,auVar10,auVar29);
                auVar10 = vblendvps_avx(auVar10,auVar7,auVar29);
                auVar7 = vpcmpgtd_avx(auVar10,auVar30);
                auVar29 = vpshufd_avx(auVar7,0xaa);
                auVar7 = vblendvps_avx(auVar10,auVar30,auVar29);
                auVar30 = vblendvps_avx(auVar30,auVar10,auVar29);
                *pauVar21 = auVar30;
                pauVar21[1] = auVar7;
                uVar22 = auVar6._0_8_;
                pauVar21 = pauVar21 + 2;
              }
              else {
                lVar19 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                auVar42._8_8_ = 0;
                auVar42._0_8_ = *(ulong *)(uVar23 + lVar19 * 8);
                auVar33 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_1008 + lVar19 * 4)));
                auVar29 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar6,auVar30,auVar29);
                auVar30 = vblendvps_avx(auVar30,auVar6,auVar29);
                auVar6 = vpcmpgtd_avx(auVar33,auVar7);
                auVar29 = vpshufd_avx(auVar6,0xaa);
                auVar6 = vblendvps_avx(auVar33,auVar7,auVar29);
                auVar7 = vblendvps_avx(auVar7,auVar33,auVar29);
                auVar29 = vpcmpgtd_avx(auVar7,auVar30);
                auVar33 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar7,auVar30,auVar33);
                auVar30 = vblendvps_avx(auVar30,auVar7,auVar33);
                auVar7 = vpcmpgtd_avx(auVar6,auVar10);
                auVar33 = vpshufd_avx(auVar7,0xaa);
                auVar7 = vblendvps_avx(auVar6,auVar10,auVar33);
                auVar6 = vblendvps_avx(auVar10,auVar6,auVar33);
                auVar10 = vpcmpgtd_avx(auVar29,auVar6);
                auVar33 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar29,auVar6,auVar33);
                auVar6 = vblendvps_avx(auVar6,auVar29,auVar33);
                *pauVar21 = auVar30;
                pauVar21[1] = auVar6;
                pauVar21[2] = auVar10;
                uVar22 = auVar7._0_8_;
                pauVar21 = pauVar21 + 3;
              }
            }
          }
          goto LAB_011eae88;
        }
        if (pauVar21 == (undefined1 (*) [16])&local_f78) {
          return bVar15;
        }
      }
      auVar26 = ZEXT1664(local_fd8);
LAB_011eb37a:
      auVar24._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar24._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar24._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar24._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    } while (pauVar21 != (undefined1 (*) [16])&local_f78);
  }
  return bVar15;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }